

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBrake.cpp
# Opt level: O1

void __thiscall chrono::ChLinkBrake::ArchiveOUT(ChLinkBrake *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkBrake>(marchive);
  ChLinkLock::ArchiveOUT(&this->super_ChLinkLock,marchive);
  local_30 = &this->brake_torque;
  local_38 = "brake_torque";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->stick_ratio;
  local_38 = "stick_ratio";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = (double *)&this->brake_mode;
  local_38 = "brake_mode";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  return;
}

Assistant:

void ChLinkBrake::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkBrake>();

    // serialize parent class
    ChLinkLock::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(brake_torque);
    marchive << CHNVP(stick_ratio);
    marchive << CHNVP(brake_mode);
}